

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 tt_cmap2_char_next(TT_CMap cmap,FT_UInt32 *pcharcode)

{
  FT_Byte *table;
  uint uVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ushort *puVar8;
  ushort uVar9;
  FT_UInt32 FVar10;
  uint char_code;
  
  table = cmap->data;
  uVar1 = *pcharcode + 1;
LAB_002027bd:
  char_code = uVar1;
  if (char_code < 0x10000) {
    puVar2 = (ushort *)tt_cmap2_get_subheader(table,char_code);
    if (puVar2 != (ushort *)0x0) goto code_r0x002027df;
    goto LAB_00202886;
  }
LAB_002028a6:
  uVar1 = 0;
  FVar10 = 0;
LAB_002028a8:
  *pcharcode = FVar10;
  return uVar1;
code_r0x002027df:
  uVar3 = *puVar2 << 8 | *puVar2 >> 8;
  uVar4 = puVar2[1] << 8 | puVar2[1] >> 8;
  uVar7 = char_code & 0xff;
  if ((0xff < char_code) || (uVar1 = 0x100, uVar7 < (uint)uVar4 + (uint)uVar3)) {
    uVar9 = puVar2[3] << 8 | puVar2[3] >> 8;
    if (uVar9 == 0) {
      if (char_code == 0x100) goto LAB_002028a6;
    }
    else {
      uVar6 = (uint)uVar3;
      uVar5 = uVar7 - uVar6;
      uVar1 = (uint)uVar3;
      if (uVar7 >= uVar6 && uVar5 != 0) {
        uVar1 = uVar7;
      }
      if (uVar7 < uVar6) {
        uVar5 = 0;
      }
      puVar8 = (ushort *)((long)puVar2 + (ulong)((uint)uVar9 + uVar5 * 2) + 6);
      FVar10 = (char_code & 0xff00) + uVar1;
      for (; uVar5 < uVar4; uVar5 = uVar5 + 1) {
        uVar3 = *puVar8 << 8 | *puVar8 >> 8;
        if ((uVar3 != 0) &&
           (uVar1 = (uint)uVar3 + (uint)(ushort)(puVar2[2] << 8 | puVar2[2] >> 8) & 0xffff,
           uVar1 != 0)) goto LAB_002028a8;
        FVar10 = FVar10 + 1;
        puVar8 = puVar8 + 1;
      }
      char_code = (FVar10 - 1) + (uint)(uVar4 == 0);
    }
LAB_00202886:
    uVar1 = (char_code & 0xffffff00) + 0x100;
    if (char_code < 0x100) {
      uVar1 = char_code + 1;
    }
  }
  goto LAB_002027bd;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap2_char_next( TT_CMap     cmap,
                      FT_UInt32  *pcharcode )
  {
    FT_Byte*   table    = cmap->data;
    FT_UInt    gindex   = 0;
    FT_UInt32  result   = 0;
    FT_UInt32  charcode = *pcharcode + 1;
    FT_Byte*   subheader;


    while ( charcode < 0x10000UL )
    {
      subheader = tt_cmap2_get_subheader( table, charcode );
      if ( subheader )
      {
        FT_Byte*  p       = subheader;
        FT_UInt   start   = TT_NEXT_USHORT( p );
        FT_UInt   count   = TT_NEXT_USHORT( p );
        FT_Int    delta   = TT_NEXT_SHORT ( p );
        FT_UInt   offset  = TT_PEEK_USHORT( p );
        FT_UInt   char_lo = (FT_UInt)( charcode & 0xFF );
        FT_UInt   pos, idx;


        if ( char_lo >= start + count && charcode <= 0xFF )
        {
          /* this happens only for a malformed cmap */
          charcode = 0x100;
          continue;
        }

        if ( offset == 0 )
        {
          if ( charcode == 0x100 )
            goto Exit; /* this happens only for a malformed cmap */
          goto Next_SubHeader;
        }

        if ( char_lo < start )
        {
          char_lo = start;
          pos     = 0;
        }
        else
          pos = (FT_UInt)( char_lo - start );

        p       += offset + pos * 2;
        charcode = FT_PAD_FLOOR( charcode, 256 ) + char_lo;

        for ( ; pos < count; pos++, charcode++ )
        {
          idx = TT_NEXT_USHORT( p );

          if ( idx != 0 )
          {
            gindex = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
            if ( gindex != 0 )
            {
              result = charcode;
              goto Exit;
            }
          }
        }

        /* if unsuccessful, avoid `charcode' leaving */
        /* the current 256-character block           */
        if ( count )
          charcode--;
      }

      /* If `charcode' is <= 0xFF, retry with `charcode + 1'.      */
      /* Otherwise jump to the next 256-character block and retry. */
    Next_SubHeader:
      if ( charcode <= 0xFF )
        charcode++;
      else
        charcode = FT_PAD_FLOOR( charcode, 0x100 ) + 0x100;
    }

  Exit:
    *pcharcode = result;

    return gindex;
  }